

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

void __thiscall higan::EventLoop::HandleTimeoutEvent(EventLoop *this)

{
  bool bVar1;
  LogLevel LVar2;
  undefined8 uVar3;
  TimerCallback *this_00;
  Fmt local_348;
  Logger local_248;
  reference local_30;
  Timer *timer;
  iterator __end1;
  iterator __begin1;
  vector<higan::Timer,_std::allocator<higan::Timer>_> *__range1;
  EventLoop *this_local;
  
  std::vector<higan::Timer,_std::allocator<higan::Timer>_>::clear(&this->timeout_timers_);
  TimerManager::GetTimeoutTimer(&this->timer_manager_,&this->timeout_timers_);
  __end1 = std::vector<higan::Timer,_std::allocator<higan::Timer>_>::begin(&this->timeout_timers_);
  timer = (Timer *)std::vector<higan::Timer,_std::allocator<higan::Timer>_>::end
                             (&this->timeout_timers_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<higan::Timer_*,_std::vector<higan::Timer,_std::allocator<higan::Timer>_>_>
                                *)&timer);
    if (!bVar1) break;
    local_30 = __gnu_cxx::
               __normal_iterator<higan::Timer_*,_std::vector<higan::Timer,_std::allocator<higan::Timer>_>_>
               ::operator*(&__end1);
    LVar2 = Logger::GetLogLevel();
    if ((int)LVar2 < 2) {
      Logger::Logger(&local_248,INFO,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/EventLoop.cpp"
                     ,0x54,"HandleTimeoutEvent");
      Timer::GetName_abi_cxx11_(local_30);
      uVar3 = std::__cxx11::string::c_str();
      Fmt::Fmt(&local_348,"Timer: %s timeout",uVar3);
      Logger::operator<<(&local_248,&local_348);
      Logger::~Logger(&local_248);
    }
    this_00 = Timer::GetTimerCallback(local_30);
    std::function<void_(const_higan::Timer_&)>::operator()(this_00,local_30);
    __gnu_cxx::
    __normal_iterator<higan::Timer_*,_std::vector<higan::Timer,_std::allocator<higan::Timer>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void EventLoop::HandleTimeoutEvent()
{
	timeout_timers_.clear();
	timer_manager_.GetTimeoutTimer(&timeout_timers_);

	for (const Timer& timer : timeout_timers_)
	{
		LOG_INFO << higan::Fmt("Timer: %s timeout", timer.GetName().c_str());
		timer.GetTimerCallback()(timer);
	}
}